

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

void __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::reset
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this)

{
  size_type sVar1;
  
  while( true ) {
    sVar1 = std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::size
                      (&(this->parsingStack).c);
    if (sVar1 < 2) break;
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
              (&(this->parsingStack).c);
  }
  return;
}

Assistant:

void reset() {
        while (parsingStack.size() > 1) {
            parsingStack.pop();
        }
    }